

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O0

Constant *
spvtools::opt::descsroautil::GetAccessChainIndexAsConst
          (IRContext *context,Instruction *access_chain)

{
  uint32_t uVar1;
  ConstantManager *this;
  Constant *idx_const;
  uint32_t idx_id;
  Instruction *access_chain_local;
  IRContext *context_local;
  
  uVar1 = Instruction::NumInOperands(access_chain);
  if (uVar1 < 2) {
    context_local = (IRContext *)0x0;
  }
  else {
    uVar1 = GetFirstIndexOfAccessChain(access_chain);
    this = IRContext::get_constant_mgr(context);
    context_local = (IRContext *)analysis::ConstantManager::FindDeclaredConstant(this,uVar1);
  }
  return (Constant *)context_local;
}

Assistant:

const analysis::Constant* GetAccessChainIndexAsConst(
    IRContext* context, Instruction* access_chain) {
  if (access_chain->NumInOperands() <= 1) {
    return nullptr;
  }
  uint32_t idx_id = GetFirstIndexOfAccessChain(access_chain);
  const analysis::Constant* idx_const =
      context->get_constant_mgr()->FindDeclaredConstant(idx_id);
  return idx_const;
}